

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  char *pcVar7;
  string *psVar8;
  uint *puVar9;
  Arena *arena;
  int unaff_R12D;
  ushort *puVar10;
  long *plVar11;
  pair<const_char_*,_int> pVar12;
  int local_48;
  char *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar9 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar9 & 3) != 0) {
      AlignFail(puVar9);
    }
    *puVar9 = *puVar9 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar11 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar11 & 7) != 0) {
    AlignFail(plVar11);
  }
  lVar1 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar11 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar5 = ClassData::New(*(ClassData **)(lVar1 + 0x20),arena);
    *plVar11 = (long)pMVar5;
  }
  if (ptr[2] < '\0') {
    pVar12 = ReadSizeFallback(ptr + 2,(uint)(byte)ptr[2]);
    puVar10 = (ushort *)pVar12.first;
  }
  else {
    puVar10 = (ushort *)(ptr + 3);
  }
  if ((puVar10 == (ushort *)0x0) || (ctx->depth_ < 1)) {
    puVar10 = (ushort *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)puVar10);
    ctx->depth_ = ctx->depth_ + -1;
    unaff_R12D = local_48;
  }
  if (puVar10 != (ushort *)0x0) {
    local_38 = (char *)(long)ctx->depth_;
    lVar2 = *plVar11;
    _local_48 = puVar10;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffb8,
                              ctx->group_depth_), !bVar3) {
      uVar4 = (uint)*(byte *)(lVar1 + 8) & (uint)*_local_48;
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar6 = (ulong)(uVar4 & 0xfffffff8);
      _local_48 = (ushort *)
                  (**(code **)(lVar1 + 0x38 + uVar6 * 2))
                            (lVar2,_local_48,ctx,
                             (ulong)*_local_48 ^ *(ulong *)(lVar1 + 0x40 + uVar6 * 2),lVar1,0);
      if ((_local_48 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    puVar10 = _local_48;
    if ((*(byte *)(lVar1 + 9) & 1) != 0) {
      puVar10 = (ushort *)(**(code **)(lVar1 + 0x28))(lVar2,_local_48,ctx);
    }
    if (puVar10 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        psVar8 = (string *)0x0;
      }
      else {
        psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar8 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,*(undefined8 *)(psVar8 + 8),*(undefined8 *)psVar8);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8);
      }
    }
    ctx->depth_ = ctx->depth_ + 1;
    uVar4 = unaff_R12D + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar4;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
      return (char *)puVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}